

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::clara::TextFlow::Column::iterator::calcLength(iterator *this)

{
  char cVar1;
  Column *pCVar2;
  ulong uVar3;
  pointer pbVar4;
  long lVar5;
  void *pvVar6;
  bool bVar7;
  void *pvVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  size_t sVar13;
  
  pCVar2 = this->m_column;
  uVar3 = this->m_stringIndex;
  pbVar4 = (pCVar2->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(pCVar2->m_strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) <= uVar3) {
    __assert_fail("m_stringIndex < m_column.m_strings.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Catch2/catch.hpp"
                  ,0x2145,"void Catch::clara::TextFlow::Column::iterator::calcLength()");
  }
  this->m_suffix = false;
  sVar12 = this->m_pos;
  sVar9 = 0xffffffffffffffff;
  if (sVar12 == 0 && uVar3 == 0) {
    sVar9 = pCVar2->m_initialIndent;
  }
  if (sVar9 == 0xffffffffffffffff) {
    sVar9 = pCVar2->m_indent;
  }
  sVar13 = pCVar2->m_width;
  this->m_end = sVar12;
  lVar5 = *(long *)&pbVar4[uVar3]._M_dataplus;
  if (*(char *)(lVar5 + sVar12) == '\n') {
    this->m_end = sVar12 + 1;
  }
  sVar13 = sVar13 - sVar9;
  uVar3 = *(size_type *)((long)(pbVar4 + uVar3) + 8);
  uVar10 = this->m_end;
  uVar11 = uVar10;
  if (uVar10 < uVar3) {
    do {
      uVar11 = uVar10;
      if (*(char *)(lVar5 + uVar10) == '\n') break;
      uVar10 = uVar10 + 1;
      this->m_end = uVar10;
      uVar11 = uVar3;
    } while (uVar3 != uVar10);
  }
  if (sVar13 + sVar12 <= uVar11) {
    sVar12 = sVar13;
    if (sVar13 != 0) {
      do {
        bVar7 = isBoundary(this,this->m_pos + sVar12);
        if (bVar7) goto joined_r0x0014249a;
        sVar12 = sVar12 - 1;
      } while (sVar12 != 0);
      sVar12 = 0;
    }
joined_r0x0014249a:
    do {
      if (sVar12 == 0) goto LAB_001424fb;
      cVar1 = *(char *)((sVar12 - 1) +
                       *(long *)&(this->m_column->m_strings).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[this->m_stringIndex].
                                 _M_dataplus + this->m_pos);
      if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
        calcLength();
      }
      pvVar6 = isWhitespace(char)::chars_abi_cxx11_;
      if (((DAT_0018ed48 == 0) ||
          (pvVar8 = memchr(isWhitespace(char)::chars_abi_cxx11_,(int)cVar1,DAT_0018ed48),
          pvVar8 == (void *)0x0)) || ((long)pvVar8 - (long)pvVar6 == -1)) goto LAB_00142505;
      sVar12 = sVar12 - 1;
    } while( true );
  }
  sVar12 = uVar11 - sVar12;
LAB_00142505:
  this->m_len = sVar12;
  return;
LAB_001424fb:
  this->m_suffix = true;
  sVar12 = sVar13 - 1;
  goto LAB_00142505;
}

Assistant:

void calcLength() {
			assert(m_stringIndex < m_column.m_strings.size());

			m_suffix = false;
			auto width = m_column.m_width - indent();
			m_end = m_pos;
			if (line()[m_pos] == '\n') {
				++m_end;
			}
			while (m_end < line().size() && line()[m_end] != '\n')
				++m_end;

			if (m_end < m_pos + width) {
				m_len = m_end - m_pos;
			} else {
				size_t len = width;
				while (len > 0 && !isBoundary(m_pos + len))
					--len;
				while (len > 0 && isWhitespace(line()[m_pos + len - 1]))
					--len;

				if (len > 0) {
					m_len = len;
				} else {
					m_suffix = true;
					m_len = width - 1;
				}
			}
		}